

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O1

void __thiscall cmCTestBuildCommand::cmCTestBuildCommand(cmCTestBuildCommand *this)

{
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.super_cmObject.
  _vptr_cmObject = (_func_int **)&PTR__cmCTestBuildCommand_006bb3f0;
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[6] = "NUMBER_ERRORS";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[7] = "NUMBER_WARNINGS";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[8] = "TARGET";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[9] = "CONFIGURATION";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[10] = "FLAGS";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xb] = "PROJECT_NAME";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xc] = (char *)0x0;
  (this->super_cmCTestHandlerCommand).Last = 0xc;
  return;
}

Assistant:

cmCTestBuildCommand::cmCTestBuildCommand()
{
  this->GlobalGenerator = 0;
  this->Arguments[ctb_NUMBER_ERRORS] = "NUMBER_ERRORS";
  this->Arguments[ctb_NUMBER_WARNINGS] = "NUMBER_WARNINGS";
  this->Arguments[ctb_TARGET] = "TARGET";
  this->Arguments[ctb_CONFIGURATION] = "CONFIGURATION";
  this->Arguments[ctb_FLAGS] = "FLAGS";
  this->Arguments[ctb_PROJECT_NAME] = "PROJECT_NAME";
  this->Arguments[ctb_LAST] = 0;
  this->Last = ctb_LAST;
}